

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

TonkResult
tonk_advertise(TonkSocket tonkSocket,char *ipString,uint16_t port,void *data,uint32_t bytes)

{
  long in_RCX;
  short in_DX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  Result result;
  ApplicationSession *session;
  uint32_t in_stack_000000ec;
  void *in_stack_000000f0;
  uint16_t in_stack_000000fe;
  char *in_stack_00000100;
  ApplicationSession *in_stack_00000108;
  undefined4 in_stack_ffffffffffffffb4;
  Result local_40 [7];
  TonkResult local_4;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_DX == 0)) ||
     (((in_RCX == 0 && (in_R8D != 0)) || (0x500 < in_R8D)))) {
    local_4 = Tonk_InvalidInput;
  }
  else {
    tonk::ApplicationSession::tonk_advertise
              (in_stack_00000108,in_stack_00000100,in_stack_000000fe,in_stack_000000f0,
               in_stack_000000ec);
    local_4 = TonkResultFromDetailedResult(local_40);
    tonk::Result::~Result((Result *)CONCAT44(in_stack_ffffffffffffffb4,local_4));
  }
  return local_4;
}

Assistant:

TONK_EXPORT TonkResult tonk_advertise(
    TonkSocket tonkSocket, ///< [in] Socket to send advertisement from
    const char*  ipString, ///< [in] Destination IP address
    uint16_t         port, ///< [in] Destination port
    const void*      data, ///< [in] Message data
    uint32_t        bytes  ///< [in] Message bytes
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (!session || !ipString || port == 0 ||
        (data == nullptr && bytes > 0) ||
        bytes > TONK_MAX_UNRELIABLE_BYTES)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = session->tonk_advertise(ipString, port, data, bytes);
    return TonkResultFromDetailedResult(result);
}